

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O3

void __thiscall ImgfsFile::nameinfo::getdata(nameinfo *this,uint8_t *p,ImgfsFile *imgfs)

{
  string *buf;
  ushort uVar1;
  ulong uVar2;
  pointer pcVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  bool bVar6;
  uint32_t uVar7;
  undefined8 *puVar8;
  int iVar9;
  ulong uVar10;
  uint size;
  Wstring wstr_1;
  Wstring wstr;
  Wstring local_b0;
  undefined1 local_90 [16];
  anon_union_16_2_edb7204a_for_basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_11
  aStack_80;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  uVar1 = this->_length;
  iVar9 = 0;
  if (uVar1 >= 5) {
    iVar9 = 2 - (uint)(uVar1 < 0x19);
  }
  uVar2 = (this->_name)._M_string_length;
  bVar6 = uVar1 < 5;
  if (4 < uVar2) {
    bVar6 = 2 - (uint)(uVar2 < 0x19) == iVar9;
  }
  uVar10 = uVar2;
  if (!bVar6) {
    if (iVar9 == 2) {
      freechunk(imgfs,(ulong)this->_ptr,((imgfs->_hdr).bytesperchunk - 1 | (uint)uVar1 * 2 - 1) + 1)
      ;
    }
    else if (iVar9 == 1) {
      freeent(imgfs,(ulong)this->_ptr);
    }
    this->_ptr = 0;
    uVar10 = (this->_name)._M_string_length;
  }
  if (uVar10 < 0x10000) {
    buf = &this->_name;
    this->_length = (uint16_t)uVar10;
    *(uint16_t *)p = (uint16_t)uVar10;
    if (uVar2 < 5) {
      *(uint16_t *)(p + 2) = this->_flags;
      ToWString<char>((Wstring *)local_90,buf);
      p[4] = '\0';
      p[5] = '\0';
      p[6] = '\0';
      p[7] = '\0';
      p[8] = '\0';
      p[9] = '\0';
      p[10] = '\0';
      p[0xb] = '\0';
      if (local_90._8_8_ != 0) {
        memmove(p + 4,(void *)local_90._0_8_,local_90._8_8_ * 2);
      }
      if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
        operator_delete((void *)local_90._0_8_,aStack_80._M_allocated_capacity * 2 + 2);
      }
    }
    else {
      if (this->_ptr == 0) {
        ToWString<char>(&local_b0,buf);
        if (uVar2 < 0x19) {
          *(byte *)&this->_flags = (byte)this->_flags | 2;
          local_90._8_8_ = 0;
          aStack_80._M_allocated_capacity = 0;
          aStack_80._8_8_ = 0;
          local_90._0_8_ = &PTR__NameEntry_001461f8;
          pcVar3 = (this->_name)._M_dataplus._M_p;
          local_70[0] = local_60;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_70,pcVar3,pcVar3 + (this->_name)._M_string_length);
          aStack_80._M_allocated_capacity._0_4_ = 0xfffffefb;
          DirEntry::save((DirEntry *)local_90,imgfs);
          uVar7 = DirEntry::offset((DirEntry *)local_90);
          this->_ptr = uVar7;
          local_90._0_8_ = &PTR__NameEntry_001461f8;
          if (local_70[0] != local_60) {
            operator_delete(local_70[0],local_60[0] + 1);
          }
        }
        else {
          size = ((imgfs->_hdr).bytesperchunk - 1 | (int)local_b0._M_string_length * 2 - 1U) + 1;
          uVar7 = allocchunk(imgfs,size,NAMECHUNK);
          this->_ptr = uVar7;
          std::__cxx11::
          basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
          ::resize(&local_b0,(ulong)(size >> 1),0);
          peVar4 = (imgfs->_rd).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var5 = (imgfs->_rd).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
            }
          }
          (*peVar4->_vptr_ReadWriter[4])(peVar4,(ulong)this->_ptr);
          if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
          }
          peVar4 = (imgfs->_rd).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var5 = (imgfs->_rd).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
            }
          }
          (*peVar4->_vptr_ReadWriter[3])(peVar4,local_b0._M_dataplus._M_p,(ulong)size);
          if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity * 2 + 2);
        }
        uVar10 = (this->_name)._M_string_length;
      }
      pcVar3 = (buf->_M_dataplus)._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar3,pcVar3 + uVar10);
      uVar7 = calc_name_hash(&local_50);
      this->_hash = uVar7;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        uVar7 = this->_hash;
      }
      *(uint16_t *)(p + 2) = this->_flags;
      *(uint32_t *)(p + 4) = uVar7;
      *(uint32_t *)(p + 8) = this->_ptr;
    }
    return;
  }
  puVar8 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar8 = "filename too long";
  __cxa_throw(puVar8,&char_const*::typeinfo,0);
}

Assistant:

void getdata(uint8_t *p, ImgfsFile& imgfs)
        {
            int oldtype= nametype(_length);
            int newtype= nametype(_name.size());

            // first free resources
            if (oldtype!=newtype) {
                if (oldtype==IN_NAME_ENTRY)
                    imgfs.freeent(_ptr);
                else if (oldtype==IN_NAME_CHUNK)
                    imgfs.freechunk(_ptr, imgfs.roundtochunk(_length*sizeof(WCHAR)));
                _ptr= 0;
            }
            if (_name.size()>=0x10000)
                throw "filename too long";
            _length= (uint16_t)_name.size();
            set16le(p, _length);
            if (newtype==IN_DIR_ENTRY) {
                set16le(p+2, _flags);
                std::Wstring wstr= ToWString(_name);
                std::fill_n((WCHAR*)(p+4), 4, WCHAR(0));
                // note: nonportable endian cast
                std::copy(wstr.begin(), wstr.end(), (WCHAR*)(p+4));
            }
            else {
                if (_ptr==0) {
                    std::Wstring wstr= ToWString(_name);
                    if (newtype==IN_NAME_ENTRY)
                    {
                        _flags|= 2;
                        NameEntry ent(_name);
                        ent.save(imgfs);
                        _ptr= ent.offset();
                    }
                    else {
                        size_t rounded= imgfs.roundtochunk(wstr.size()*sizeof(WCHAR));
                        // alloc chunk
                        _ptr= imgfs.allocchunk(rounded, NAMECHUNK);

                        wstr.resize(rounded/sizeof(WCHAR));
                        imgfs.rd()->setpos(_ptr);
                        //printf("nameinfo: getdata(%08x)\n", _ptr);
                        imgfs.rd()->write((const uint8_t*)wstr.c_str(), rounded);
                    }
                }
                _hash= calc_name_hash(_name);
                set16le(p+2, _flags);
                set32le(p+4, _hash);
                set32le(p+8, _ptr);
            }
        }